

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extent_grow_retained
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,size_t size,size_t pad,
          size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  _Bool _Var1;
  uint uVar2;
  extent_split_interior_result_t eVar3;
  extent_t *peVar4;
  void *pvVar5;
  size_t __n;
  tsdn_t *in_RCX;
  extent_hooks_t **in_RDX;
  arena_t *in_RSI;
  undefined1 *in_RDI;
  extent_t *in_R8;
  rtree_ctx_t *in_R9;
  byte in_stack_00000008;
  byte *in_stack_00000018;
  byte *in_stack_00000020;
  size_t size_1;
  void *addr;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  extent_split_interior_result_t result;
  extent_t *to_salvage;
  extent_t *to_leak;
  extent_t *trail;
  extent_t *lead;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  void *ptr;
  _Bool committed;
  _Bool zeroed;
  extent_t *extent;
  size_t alloc_size;
  pszind_t egn_skip;
  size_t alloc_size_min;
  size_t esize;
  uint8_t state_1;
  uint8_t state;
  pszind_t ind;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  tsdn_t *in_stack_fffffffffffffa88;
  arena_t *paVar6;
  tsdn_t *in_stack_fffffffffffffa90;
  tsdn_t *ptVar7;
  malloc_mutex_t *in_stack_fffffffffffffa98;
  undefined4 uVar8;
  arena_t *in_stack_fffffffffffffaa0;
  undefined4 uVar9;
  tsdn_t *in_stack_fffffffffffffaa8;
  undefined4 uVar10;
  szind_t szind_00;
  arena_t *in_stack_fffffffffffffab0;
  extent_t *in_stack_fffffffffffffab8;
  rtree_ctx_t *prVar11;
  undefined4 in_stack_fffffffffffffac4;
  undefined1 in_stack_fffffffffffffacf;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffad4;
  extents_t *in_stack_fffffffffffffad8;
  nstime_t offset;
  extent_hooks_t **in_stack_fffffffffffffae0;
  nstime_t extent_00;
  arena_t *in_stack_fffffffffffffae8;
  tsdn_t *in_stack_fffffffffffffaf0;
  arena_t *arena_00;
  size_t in_stack_fffffffffffffaf8;
  arena_t *tsdn_00;
  size_t in_stack_fffffffffffffb00;
  void *in_stack_fffffffffffffb08;
  undefined2 uVar13;
  arena_t *in_stack_fffffffffffffb10;
  extent_hooks_t *in_stack_fffffffffffffb18;
  rtree_ctx_t *in_stack_fffffffffffffb20;
  extent_hooks_t **in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  int in_stack_fffffffffffffb38;
  uint in_stack_fffffffffffffb3c;
  _Bool *in_stack_fffffffffffffb40;
  rtree_leaf_elm_t *in_stack_fffffffffffffb60;
  extent_t **in_stack_fffffffffffffb68;
  rtree_leaf_elm_t *in_stack_fffffffffffffb70;
  void *in_stack_fffffffffffffb78;
  rtree_leaf_elm_t *in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb88;
  rtree_leaf_elm_t *in_stack_fffffffffffffb90;
  szind_t in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffbf8;
  extent_t *in_stack_fffffffffffffc00;
  tsdn_t *in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc27;
  extent_t *in_stack_fffffffffffffc28;
  extents_t *in_stack_fffffffffffffc30;
  extent_hooks_t **in_stack_fffffffffffffc38;
  arena_t *in_stack_fffffffffffffc40;
  tsdn_t *in_stack_fffffffffffffc48;
  undefined1 local_320 [16];
  undefined1 local_310 [408];
  void *local_178;
  byte local_16a;
  byte local_169;
  arena_t *local_168;
  rtree_ctx_t *local_160;
  int local_154;
  nstime_t local_150;
  rtree_ctx_t *local_148;
  byte local_139;
  rtree_ctx_t *local_138;
  extent_t *local_130;
  undefined8 local_128;
  extent_hooks_t **local_120;
  nstime_t local_118;
  nstime_t local_110;
  rtree_ctx_t *local_100;
  undefined1 *local_f8;
  rtree_ctx_t *local_f0;
  rtree_ctx_t *local_e8;
  undefined1 *local_e0;
  nstime_t local_d8;
  nstime_t local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  tsdn_t *local_a8;
  undefined1 local_99;
  nstime_t local_98;
  nstime_t local_90;
  undefined1 local_81;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  tsdn_t *local_68;
  uint local_60;
  uint local_5c;
  nstime_t local_58;
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  uint64_t local_40;
  atomic_u32_t local_34;
  
  local_139 = in_stack_00000008 & 1;
  local_138 = in_R9;
  local_130 = in_R8;
  local_128 = in_RCX;
  local_120 = in_RDX;
  local_118.ns = (uint64_t)in_RSI;
  local_110.ns = (uint64_t)in_RDI;
  malloc_mutex_assert_owner(in_stack_fffffffffffffa88,(malloc_mutex_t *)0x1734e4);
  local_148 = (rtree_ctx_t *)((long)&local_130->e_bits + (long)&local_128->tsd);
  local_150.ns = (long)local_148 +
                 (((ulong)((long)&local_138[10].cache[0xf].leaf + 7U) & 0xfffffffffffff000) - 0x1000
                 );
  if (local_148 <= local_150.ns) {
    local_154 = 0;
    local_160 = (rtree_ctx_t *)sz_pind2sz(0);
    while( true ) {
      uVar12 = (undefined4)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      if (local_150.ns <= local_160) break;
      local_154 = local_154 + 1;
      in_stack_fffffffffffffb3c = *(pszind_t *)(local_118.ns + 0x7110) + local_154;
      local_40 = 0x7000000000000000;
      local_44 = lg_floor(0xdfffffffffffffff);
      if (local_44 < 0xe) {
        in_stack_fffffffffffffb38 = 0;
      }
      else {
        in_stack_fffffffffffffb38 = local_44 - 0xe;
      }
      local_4c = in_stack_fffffffffffffb38 * 4;
      if (local_44 < 0xf) {
        in_stack_fffffffffffffb34 = 0xc;
      }
      else {
        in_stack_fffffffffffffb34 = local_44 - 3;
      }
      local_58.ns = -1L << ((byte)in_stack_fffffffffffffb34 & 0x3f);
      local_5c = (uint)((local_40 - 1 & local_58.ns) >> ((byte)in_stack_fffffffffffffb34 & 0x3f)) &
                 3;
      local_60 = local_4c + local_5c;
      local_50 = in_stack_fffffffffffffb34;
      local_48 = in_stack_fffffffffffffb38;
      local_34.repr = local_60;
      if (local_60 <= in_stack_fffffffffffffb3c) goto LAB_0017404b;
      local_160 = (rtree_ctx_t *)sz_pind2sz(0);
    }
    local_168 = (arena_t *)extent_alloc(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    if (local_168 != (arena_t *)0x0) {
      local_169 = 0;
      local_16a = 0;
      if (*local_120 == &extent_hooks_default) {
        local_178 = extent_alloc_default_impl
                              ((tsdn_t *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                               in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                               in_stack_fffffffffffffaf8,(_Bool *)in_stack_fffffffffffffaf0,
                               in_stack_fffffffffffffb40);
        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
        uVar9 = (undefined4)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
        uVar8 = (undefined4)((ulong)in_stack_fffffffffffffa98 >> 0x20);
        uVar2 = (uint)((ulong)in_stack_fffffffffffffa90 >> 0x20);
      }
      else {
        extent_hook_pre_reentrancy(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
        uVar9 = (undefined4)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
        uVar8 = (undefined4)((ulong)in_stack_fffffffffffffa98 >> 0x20);
        in_stack_fffffffffffffb28 = (extent_hooks_t **)(*local_120)->alloc;
        in_stack_fffffffffffffb18 = *local_120;
        in_stack_fffffffffffffb20 = local_160;
        uVar2 = arena_ind_get((arena_t *)0x173826);
        local_178 = (void *)(*(code *)in_stack_fffffffffffffb28)
                                      (in_stack_fffffffffffffb18,0,in_stack_fffffffffffffb20,0x1000,
                                       &local_169,&local_16a,CONCAT44(uVar12,uVar2));
        extent_hook_post_reentrancy(in_stack_fffffffffffffa90);
        uVar2 = (uint)((ulong)in_stack_fffffffffffffa90 >> 0x20);
      }
      tsdn_00 = local_168;
      pvVar5 = local_178;
      prVar11 = local_160;
      peVar4 = (extent_t *)arena_extent_sn_next((arena_t *)local_118.ns);
      uVar13 = (undefined2)((ulong)pvVar5 >> 0x30);
      ptVar7 = (tsdn_t *)((ulong)uVar2 << 0x20);
      in_stack_fffffffffffffa98 = (malloc_mutex_t *)CONCAT44(uVar8,(uint)(local_169 & 1));
      in_stack_fffffffffffffaa0 = (arena_t *)CONCAT44(uVar9,(uint)(local_16a & 1));
      paVar6 = (arena_t *)CONCAT44(uVar10,1);
      extent_init(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,paVar6,
                  (size_t)in_stack_fffffffffffffaa0,SUB41((uint)uVar8 >> 0x18,0),
                  (uint)(local_169 & 1),
                  CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                  (extent_state_t)in_stack_fffffffffffffad8,SUB41(uVar2 >> 0x18,0),
                  SUB41(uVar2 >> 0x10,0),SUB41(uVar2 >> 8,0));
      if (local_178 == (void *)0x0) {
        extent_dalloc((tsdn_t *)in_stack_fffffffffffffab0,paVar6,
                      (extent_t *)in_stack_fffffffffffffaa0);
      }
      else {
        _Var1 = extent_register_no_gdump_add(ptVar7,peVar4);
        if (_Var1) {
          extents_leak(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0
                       ,in_stack_fffffffffffffad8,
                       (extent_t *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       (_Bool)in_stack_fffffffffffffacf);
        }
        else {
          _Var1 = extent_zeroed_get((extent_t *)local_168);
          if ((_Var1) && (_Var1 = extent_committed_get((extent_t *)local_168), _Var1)) {
            *in_stack_00000018 = 1;
          }
          _Var1 = extent_committed_get((extent_t *)local_168);
          if (_Var1) {
            *in_stack_00000020 = 1;
          }
          local_e0 = (undefined1 *)local_110.ns;
          local_e8 = (rtree_ctx_t *)(local_310 + 0x18);
          local_d0.ns = local_110.ns;
          if ((undefined1 *)local_110.ns == (undefined1 *)0x0) {
            rtree_ctx_data_init(local_e8);
            local_d8.ns = (uint64_t)local_e8;
          }
          else {
            local_c0 = (undefined1 *)local_110.ns;
            local_b0 = (undefined1 *)local_110.ns;
            local_80 = (undefined1 *)local_110.ns;
            local_78 = (undefined1 *)local_110.ns;
            local_81 = *(undefined1 *)local_110.ns;
            local_70 = (undefined1 *)local_110.ns;
            local_d8.ns = local_110.ns + 0x30;
          }
          local_310._16_8_ = local_d8.ns;
          paVar6 = (arena_t *)local_310;
          ptVar7 = (tsdn_t *)(local_320 + 8);
          in_stack_fffffffffffffa98 = (malloc_mutex_t *)local_320;
          in_stack_fffffffffffffaa0 = (arena_t *)0x0;
          uVar2 = (uint)(local_139 & 1);
          uVar12 = 1;
          peVar4 = local_130;
          szind_00 = local_128._4_4_;
          eVar3 = extent_split_interior
                            ((tsdn_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                             ,(arena_t *)
                              CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                             in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                             (extent_t **)in_stack_fffffffffffffb18,(extent_t **)prVar11,
                             (extent_t **)in_stack_fffffffffffffb60,in_stack_fffffffffffffb68,
                             (extent_t **)in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,
                             (size_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,
                             (size_t)in_stack_fffffffffffffb90,SUB21((ushort)uVar13 >> 8,0),
                             in_stack_fffffffffffffba0,SUB21(uVar13,0));
          if (eVar3 == extent_split_interior_ok) {
            prVar11 = local_138;
            if (local_310._8_8_ != 0) {
              extent_record(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                            in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc28,(_Bool)in_stack_fffffffffffffc27);
              prVar11 = local_138;
            }
            if ((atomic_u_t  [2])local_310._0_8_ != (atomic_u_t  [2])0x0) {
              extent_record(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                            in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc28,(_Bool)in_stack_fffffffffffffc27);
            }
            if (((*in_stack_00000020 & 1) != 0) &&
               (_Var1 = extent_committed_get((extent_t *)local_168), !_Var1)) {
              offset.ns = local_110.ns;
              extent_00.ns = local_118.ns;
              arena_00 = local_168;
              extent_size_get((extent_t *)local_168);
              paVar6 = (arena_t *)CONCAT44((int)((ulong)paVar6 >> 0x20),1);
              _Var1 = extent_commit_impl((tsdn_t *)tsdn_00,arena_00,local_120,
                                         (extent_t *)extent_00.ns,offset.ns,
                                         CONCAT44(in_stack_fffffffffffffad4,uVar12),
                                         (_Bool)in_stack_fffffffffffffacf);
              if (_Var1) {
                extent_record(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                              in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                              in_stack_fffffffffffffc28,(_Bool)in_stack_fffffffffffffc27);
                goto LAB_0017404b;
              }
              _Var1 = extent_need_manual_zero(paVar6);
              if (!_Var1) {
                extent_zeroed_set((extent_t *)local_168,true);
              }
            }
            if (*(pszind_t *)(local_118.ns + 0x7114) <
                *(int *)(local_118.ns + 0x7110) + local_154 + 1U) {
              *(pszind_t *)(local_118.ns + 0x7110) = *(pszind_t *)(local_118.ns + 0x7114);
            }
            else {
              *(int *)(local_118.ns + 0x7110) = local_154 + 1 + *(int *)(local_118.ns + 0x7110);
            }
            malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
            if (local_130 != (extent_t *)0x0) {
              extent_addr_randomize
                        (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                         in_stack_fffffffffffffbf8);
            }
            if ((local_139 & 1) != 0) {
              local_f8 = (undefined1 *)local_110.ns;
              local_100 = (rtree_ctx_t *)&stack0xfffffffffffffb58;
              local_c8 = (undefined1 *)local_110.ns;
              if ((undefined1 *)local_110.ns == (undefined1 *)0x0) {
                rtree_ctx_data_init(local_100);
                local_f0 = local_100;
              }
              else {
                local_b8 = (undefined1 *)local_110.ns;
                local_a8 = (tsdn_t *)local_110.ns;
                local_98.ns = local_110.ns;
                local_90.ns = local_110.ns;
                local_99 = *(undefined1 *)local_110.ns;
                local_68 = (tsdn_t *)local_110.ns;
                local_f0 = (rtree_ctx_t *)(local_110.ns + 0x30);
              }
              extent_slab_set((extent_t *)local_168,true);
              extent_interior_register
                        ((tsdn_t *)CONCAT44(in_stack_fffffffffffffac4,uVar2),prVar11,peVar4,szind_00
                        );
            }
            if (((*in_stack_00000018 & 1) != 0) &&
               (_Var1 = extent_zeroed_get((extent_t *)local_168), !_Var1)) {
              pvVar5 = extent_base_get((extent_t *)local_168);
              __n = extent_size_get((extent_t *)local_168);
              _Var1 = extent_need_manual_zero(paVar6);
              if ((_Var1) || (_Var1 = pages_purge_forced(ptVar7,(size_t)paVar6), _Var1)) {
                memset(pvVar5,0,__n);
              }
            }
            return (extent_t *)local_168;
          }
          if ((char *)local_320._0_8_ != (char *)0x0) {
            extent_record(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                          in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          in_stack_fffffffffffffc28,(_Bool)in_stack_fffffffffffffc27);
          }
          if (local_320._8_8_ != 0) {
            extent_deregister_no_gdump_sub(ptVar7,(extent_t *)paVar6);
            extents_leak(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (extent_t *)CONCAT44(in_stack_fffffffffffffad4,uVar12),
                         (_Bool)in_stack_fffffffffffffacf);
          }
        }
      }
    }
  }
LAB_0017404b:
  malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  return (extent_t *)0x0;
}

Assistant:

static extent_t *
extent_grow_retained(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, size_t size, size_t pad, size_t alignment,
    bool slab, szind_t szind, bool *zero, bool *commit) {
	malloc_mutex_assert_owner(tsdn, &arena->extent_grow_mtx);
	assert(pad == 0 || !slab);
	assert(!*zero || !slab);

	size_t esize = size + pad;
	size_t alloc_size_min = esize + PAGE_CEILING(alignment) - PAGE;
	/* Beware size_t wrap-around. */
	if (alloc_size_min < esize) {
		goto label_err;
	}
	/*
	 * Find the next extent size in the series that would be large enough to
	 * satisfy this request.
	 */
	pszind_t egn_skip = 0;
	size_t alloc_size = sz_pind2sz(arena->extent_grow_next + egn_skip);
	while (alloc_size < alloc_size_min) {
		egn_skip++;
		if (arena->extent_grow_next + egn_skip >=
		    sz_psz2ind(SC_LARGE_MAXCLASS)) {
			/* Outside legal range. */
			goto label_err;
		}
		alloc_size = sz_pind2sz(arena->extent_grow_next + egn_skip);
	}

	extent_t *extent = extent_alloc(tsdn, arena);
	if (extent == NULL) {
		goto label_err;
	}
	bool zeroed = false;
	bool committed = false;

	void *ptr;
	if (*r_extent_hooks == &extent_hooks_default) {
		ptr = extent_alloc_default_impl(tsdn, arena, NULL,
		    alloc_size, PAGE, &zeroed, &committed);
	} else {
		extent_hook_pre_reentrancy(tsdn, arena);
		ptr = (*r_extent_hooks)->alloc(*r_extent_hooks, NULL,
		    alloc_size, PAGE, &zeroed, &committed,
		    arena_ind_get(arena));
		extent_hook_post_reentrancy(tsdn);
	}

	extent_init(extent, arena, ptr, alloc_size, false, SC_NSIZES,
	    arena_extent_sn_next(arena), extent_state_active, zeroed,
	    committed, true);
	if (ptr == NULL) {
		extent_dalloc(tsdn, arena, extent);
		goto label_err;
	}

	if (extent_register_no_gdump_add(tsdn, extent)) {
		extents_leak(tsdn, arena, r_extent_hooks,
		    &arena->extents_retained, extent, true);
		goto label_err;
	}

	if (extent_zeroed_get(extent) && extent_committed_get(extent)) {
		*zero = true;
	}
	if (extent_committed_get(extent)) {
		*commit = true;
	}

	rtree_ctx_t rtree_ctx_fallback;
	rtree_ctx_t *rtree_ctx = tsdn_rtree_ctx(tsdn, &rtree_ctx_fallback);

	extent_t *lead;
	extent_t *trail;
	extent_t *to_leak;
	extent_t *to_salvage;
	extent_split_interior_result_t result = extent_split_interior(
	    tsdn, arena, r_extent_hooks, rtree_ctx, &extent, &lead, &trail,
	    &to_leak, &to_salvage, NULL, size, pad, alignment, slab, szind,
	    true);

	if (result == extent_split_interior_ok) {
		if (lead != NULL) {
			extent_record(tsdn, arena, r_extent_hooks,
			    &arena->extents_retained, lead, true);
		}
		if (trail != NULL) {
			extent_record(tsdn, arena, r_extent_hooks,
			    &arena->extents_retained, trail, true);
		}
	} else {
		/*
		 * We should have allocated a sufficiently large extent; the
		 * cant_alloc case should not occur.
		 */
		assert(result == extent_split_interior_error);
		if (to_salvage != NULL) {
			if (config_prof) {
				extent_gdump_add(tsdn, to_salvage);
			}
			extent_record(tsdn, arena, r_extent_hooks,
			    &arena->extents_retained, to_salvage, true);
		}
		if (to_leak != NULL) {
			extent_deregister_no_gdump_sub(tsdn, to_leak);
			extents_leak(tsdn, arena, r_extent_hooks,
			    &arena->extents_retained, to_leak, true);
		}
		goto label_err;
	}

	if (*commit && !extent_committed_get(extent)) {
		if (extent_commit_impl(tsdn, arena, r_extent_hooks, extent, 0,
		    extent_size_get(extent), true)) {
			extent_record(tsdn, arena, r_extent_hooks,
			    &arena->extents_retained, extent, true);
			goto label_err;
		}
		if (!extent_need_manual_zero(arena)) {
			extent_zeroed_set(extent, true);
		}
	}

	/*
	 * Increment extent_grow_next if doing so wouldn't exceed the allowed
	 * range.
	 */
	if (arena->extent_grow_next + egn_skip + 1 <=
	    arena->retain_grow_limit) {
		arena->extent_grow_next += egn_skip + 1;
	} else {
		arena->extent_grow_next = arena->retain_grow_limit;
	}
	/* All opportunities for failure are past. */
	malloc_mutex_unlock(tsdn, &arena->extent_grow_mtx);

	if (config_prof) {
		/* Adjust gdump stats now that extent is final size. */
		extent_gdump_add(tsdn, extent);
	}
	if (pad != 0) {
		extent_addr_randomize(tsdn, extent, alignment);
	}
	if (slab) {
		rtree_ctx_t rtree_ctx_fallback;
		rtree_ctx_t *rtree_ctx = tsdn_rtree_ctx(tsdn,
		    &rtree_ctx_fallback);

		extent_slab_set(extent, true);
		extent_interior_register(tsdn, rtree_ctx, extent, szind);
	}
	if (*zero && !extent_zeroed_get(extent)) {
		void *addr = extent_base_get(extent);
		size_t size = extent_size_get(extent);
		if (extent_need_manual_zero(arena) ||
		    pages_purge_forced(addr, size)) {
			memset(addr, 0, size);
		}
	}

	return extent;
label_err:
	malloc_mutex_unlock(tsdn, &arena->extent_grow_mtx);
	return NULL;
}